

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SQInteger __thiscall SQCompiler::ChooseCompArithCharByToken(SQCompiler *this,SQInteger tok)

{
  SQInteger oper;
  SQInteger tok_local;
  SQCompiler *this_local;
  
  switch(tok) {
  case 0x121:
    oper = 0x2b;
    break;
  case 0x122:
    oper = 0x2d;
    break;
  default:
    oper = 0;
    break;
  case 0x13d:
    oper = 0x2a;
    break;
  case 0x13e:
    oper = 0x2f;
    break;
  case 0x13f:
    oper = 0x25;
  }
  return oper;
}

Assistant:

SQInteger ChooseCompArithCharByToken(SQInteger tok)
    {
        SQInteger oper;
        switch(tok){
        case TK_MINUSEQ: oper = '-'; break;
        case TK_PLUSEQ: oper = '+'; break;
        case TK_MULEQ: oper = '*'; break;
        case TK_DIVEQ: oper = '/'; break;
        case TK_MODEQ: oper = '%'; break;
        default: oper = 0; //shut up compiler
            assert(0); break;
        };
        return oper;
    }